

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineFramebufferAttachmentTests.cpp
# Opt level: O2

Move<vk::Handle<(vk::HandleType)9>_> *
vkt::pipeline::anon_unknown_0::makeImage
          (Move<vk::Handle<(vk::HandleType)9>_> *__return_storage_ptr__,DeviceInterface *vk,
          VkDevice device,VkImageCreateFlags flags,VkImageType imageType,VkFormat format,IVec3 *size
          ,deUint32 numLayers,VkImageUsageFlags usage,bool multisample)

{
  undefined4 in_register_00000084;
  VkImageCreateInfo local_60;
  
  local_60.sType = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
  local_60.pNext = (void *)0x0;
  local_60.flags = 0;
  local_60.format = VK_FORMAT_R8G8B8A8_UNORM;
  local_60.extent._0_8_ = *(undefined8 *)CONCAT44(in_register_00000084,imageType);
  local_60.extent.depth = *(deUint32 *)((undefined8 *)CONCAT44(in_register_00000084,imageType) + 1);
  local_60.mipLevels = 1;
  local_60.samples = (numLayers & 0xff) + (numLayers & 0xff) * 2 + VK_SAMPLE_COUNT_1_BIT;
  local_60.tiling = VK_IMAGE_TILING_OPTIMAL;
  local_60.usage = (VkImageUsageFlags)size;
  local_60.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  local_60.queueFamilyIndexCount = 0;
  local_60.pQueueFamilyIndices = (deUint32 *)0x0;
  local_60.initialLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  local_60.imageType = flags;
  local_60.arrayLayers = format;
  ::vk::createImage(__return_storage_ptr__,vk,device,&local_60,(VkAllocationCallbacks *)0x0);
  return __return_storage_ptr__;
}

Assistant:

Move<VkImage> makeImage (const DeviceInterface&		vk,
						 const VkDevice				device,
						 const VkImageCreateFlags	flags,
						 const VkImageType			imageType,
						 const VkFormat				format,
						 const IVec3&				size,
						 const deUint32				numLayers,
						 const VkImageUsageFlags	usage,
						 const bool					multisample)
{
	const VkImageCreateInfo imageParams =
	{
		VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO,							// VkStructureType			sType;
		DE_NULL,														// const void*				pNext;
		flags,															// VkImageCreateFlags		flags;
		imageType,														// VkImageType				imageType;
		format,															// VkFormat					format;
		makeExtent3D(size),												// VkExtent3D				extent;
		1u,																// deUint32					mipLevels;
		numLayers,														// deUint32					arrayLayers;
		multisample ? VK_SAMPLE_COUNT_4_BIT : VK_SAMPLE_COUNT_1_BIT,	// VkSampleCountFlagBits	samples;
		VK_IMAGE_TILING_OPTIMAL,										// VkImageTiling			tiling;
		usage,															// VkImageUsageFlags		usage;
		VK_SHARING_MODE_EXCLUSIVE,										// VkSharingMode			sharingMode;
		0u,																// deUint32					queueFamilyIndexCount;
		DE_NULL,														// const deUint32*			pQueueFamilyIndices;
		VK_IMAGE_LAYOUT_UNDEFINED,										// VkImageLayout			initialLayout;
	};

	return createImage(vk, device, &imageParams);
}